

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex.h
# Opt level: O0

data_node_type * __thiscall
alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::split_upwards
          (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *this,
          int key,int stop_propagation_level,
          vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
          *traversal_path,bool reuse_model,model_node_type **new_parent,bool verbose)

{
  bool bVar1;
  ostream *poVar2;
  size_type sVar3;
  const_reference pvVar4;
  data_node_type *pdVar5;
  self_type *psVar6;
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
  *in_RCX;
  int in_EDX;
  int in_ESI;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *in_RDI;
  byte in_R8B;
  uint uVar7;
  uint uVar8;
  long *in_R9;
  uint uVar9;
  double dVar10;
  byte in_stack_00000008;
  AlexNode<int,_int> *node;
  iterator __end0;
  iterator __begin0;
  vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_> *__range2;
  int i_9;
  int i_8;
  int end_bucketID;
  int mid_bucketID;
  int start_bucketID;
  int repeats;
  int top_bucketID;
  model_node_type *top_node;
  TraversalNode *top_path_node;
  int i_7;
  int i_6;
  int end_bucketID_2;
  int mid_bucketID_2;
  int start_bucketID_2;
  int repeats_2;
  int new_bucketID_1;
  int i_5;
  int right_child_idx;
  int cur_child_repeats_1;
  AlexNode<int,_int> *cur_child_1;
  int cur_1;
  int i_4;
  int j_1;
  int i_3;
  int i_2;
  int end_bucketID_1;
  int mid_bucketID_1;
  int start_bucketID_1;
  int repeats_1;
  int new_bucketID;
  int i_1;
  int j;
  int i;
  int cur_child_repeats;
  AlexNode<int,_int> *cur_child;
  int cur;
  AlexNode<int,_int> *next_right_split;
  AlexNode<int,_int> *next_left_split;
  AlexNode<int,_int> *right_half_first_child;
  AlexNode<int,_int> *left_half_first_child;
  bool pull_up_right_child;
  bool pull_up_left_child;
  model_node_type *right_split;
  model_node_type *left_split;
  bool double_left_half;
  model_node_type *cur_node;
  TraversalNode *path_node;
  int path_idx;
  AlexNode<int,_int> *prev_right_split;
  AlexNode<int,_int> *prev_left_split;
  data_node_type *new_data_node;
  data_node_type *right_leaf;
  data_node_type *left_leaf;
  int mid_boundary;
  double appending_left_bucketID;
  bool right_half_appending_left;
  bool left_half_appending_left;
  bool append_mostly_left;
  double appending_right_bucketID;
  bool right_half_appending_right;
  bool left_half_appending_right;
  bool append_mostly_right;
  int leaf_end_bucketID;
  double leaf_mid_bucketID;
  int leaf_start_bucketID;
  int leaf_repeats;
  data_node_type *leaf;
  model_node_type *parent;
  TraversalNode *parent_path_node;
  vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_> to_delete;
  undefined4 in_stack_fffffffffffffacc;
  undefined4 in_stack_fffffffffffffad0;
  undefined4 in_stack_fffffffffffffad4;
  undefined4 in_stack_fffffffffffffad8;
  undefined2 in_stack_fffffffffffffadc;
  short in_stack_fffffffffffffade;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_fffffffffffffae0;
  AlexNode<int,_int> *in_stack_fffffffffffffb08;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_fffffffffffffb10;
  undefined8 in_stack_fffffffffffffb18;
  int iVar11;
  AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *in_stack_fffffffffffffb20;
  undefined8 in_stack_fffffffffffffb48;
  FTNode *in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb5c;
  undefined1 compute_cost;
  int iVar12;
  undefined8 in_stack_fffffffffffffb60;
  data_node_type *in_stack_fffffffffffffb68;
  Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
  *in_stack_fffffffffffffb70;
  byte local_279;
  byte local_261;
  __normal_iterator<alex::AlexNode<int,_int>_**,_std::vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
  local_210;
  undefined1 *local_208;
  int local_1fc;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  model_node_type *local_1e0;
  const_reference local_1d8;
  model_node_type *local_1d0;
  int local_1c8;
  int local_1c4;
  int local_1c0;
  int local_1bc;
  int local_1b8;
  int local_1b4;
  int local_1b0;
  int local_1ac;
  int local_1a8;
  int local_1a4;
  AlexNode<int,_int> *local_1a0;
  int local_194;
  int local_18c;
  int local_188;
  int local_180;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_158;
  int local_154;
  AlexNode<int,_int> *local_150;
  int local_148;
  data_node_type *local_140;
  data_node_type *local_138;
  AlexNode<int,_int> *local_128;
  AlexNode<int,_int> *local_120;
  byte local_112;
  byte local_111;
  data_node_type *local_110;
  data_node_type *local_108;
  byte local_f9;
  model_node_type *local_f8;
  const_reference local_f0;
  int local_e4;
  data_node_type *local_e0;
  data_node_type *local_d8;
  data_node_type *local_d0;
  data_node_type *local_c8;
  data_node_type *local_c0;
  data_node_type *local_b8;
  double local_a0;
  int local_94;
  double local_90;
  byte local_83;
  undefined1 local_82;
  byte local_81;
  double local_80;
  byte local_77;
  undefined1 local_76;
  byte local_75;
  int local_74;
  double local_70;
  int local_68;
  int local_64;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *local_60;
  model_node_type *local_58;
  const_reference local_50;
  undefined1 local_48 [31];
  byte local_29;
  long *local_28;
  byte local_19;
  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
  *local_18;
  int local_10;
  int local_c;
  
  compute_cost = (undefined1)((uint)in_stack_fffffffffffffb5c >> 0x18);
  local_19 = in_R8B & 1;
  local_29 = in_stack_00000008 & 1;
  if (in_EDX < in_RDI->root_node_->level_) {
    __assert_fail("stop_propagation_level >= root_node_->level_",
                  "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/examples/../core/alex.h"
                  ,0x728,
                  "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                 );
  }
  local_28 = in_R9;
  local_18 = in_RCX;
  local_10 = in_EDX;
  local_c = in_ESI;
  std::vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>::vector
            ((vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_> *)
             0x1168df);
  local_50 = std::
             vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
             ::back((vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                     *)CONCAT44(in_stack_fffffffffffffad4,in_stack_fffffffffffffad0));
  local_58 = local_50->node;
  local_60 = (AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
              *)local_58->children_[local_50->bucketID];
  local_64 = 1 << ((local_60->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
  local_68 = local_50->bucketID - local_50->bucketID % local_64;
  local_70 = (double)local_68 + (double)local_64 / 2.0;
  local_74 = local_68 + local_64;
  (in_RDI->stats_).num_sideways_splits = (in_RDI->stats_).num_sideways_splits + 1;
  (in_RDI->stats_).num_sideways_split_keys =
       (long)local_60->num_keys_ + (in_RDI->stats_).num_sideways_split_keys;
  local_75 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
             is_append_mostly_right(local_60);
  local_76 = 0;
  local_77 = 0;
  if ((bool)local_75) {
    local_80 = LinearModel<int>::predict_double
                         (&(local_58->super_AlexNode<int,_int>).model_,local_60->max_key_);
    if ((local_80 < (double)local_68) || (local_70 <= local_80)) {
      if ((local_70 <= local_80) && (local_80 < (double)local_74)) {
        local_77 = 1;
      }
    }
    else {
      local_76 = 1;
    }
  }
  local_81 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
             is_append_mostly_left(local_60);
  local_82 = 0;
  local_83 = 0;
  if ((bool)local_81) {
    local_90 = LinearModel<int>::predict_double
                         (&(local_58->super_AlexNode<int,_int>).model_,local_60->min_key_);
    if ((local_90 < (double)local_68) || (local_70 <= local_90)) {
      if ((local_70 <= local_90) && (local_90 < (double)local_74)) {
        local_83 = 1;
      }
    }
    else {
      local_82 = 1;
    }
  }
  local_a0 = (local_70 - (local_58->super_AlexNode<int,_int>).model_.b_) /
             (local_58->super_AlexNode<int,_int>).model_.a_;
  local_94 = AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
             lower_bound<double>(in_stack_fffffffffffffae0,
                                 (double *)
                                 CONCAT26(in_stack_fffffffffffffade,
                                          CONCAT24(in_stack_fffffffffffffadc,
                                                   in_stack_fffffffffffffad8)));
  local_b8 = bulk_load_leaf_node_from_existing
                       (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                        (int)((ulong)in_stack_fffffffffffffb60 >> 0x20),
                        (int)in_stack_fffffffffffffb60,(bool)compute_cost,in_stack_fffffffffffffb50,
                        SUB81((ulong)in_stack_fffffffffffffb48 >> 0x38,0),
                        SUB81((ulong)in_stack_fffffffffffffb48 >> 0x30,0),
                        SUB81((ulong)in_stack_fffffffffffffb48 >> 0x28,0));
  local_261 = 0;
  if ((local_75 & 1) != 0) {
    local_261 = local_77;
  }
  local_279 = 0;
  if ((local_81 & 1) != 0) {
    local_279 = local_83;
  }
  uVar9 = local_279 & 1;
  uVar8 = local_261 & 1;
  uVar7 = local_19 & 1;
  local_c0 = bulk_load_leaf_node_from_existing
                       (in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                        (int)((ulong)in_stack_fffffffffffffb60 >> 0x20),
                        (int)in_stack_fffffffffffffb60,(bool)compute_cost,in_stack_fffffffffffffb50,
                        SUB81((ulong)in_stack_fffffffffffffb48 >> 0x38,0),
                        SUB81((ulong)in_stack_fffffffffffffb48 >> 0x30,0),
                        SUB81((ulong)in_stack_fffffffffffffb48 >> 0x28,0));
  (local_b8->super_AlexNode<int,_int>).duplication_factor_ =
       (local_60->super_AlexNode<int,_int>).duplication_factor_;
  (local_c0->super_AlexNode<int,_int>).duplication_factor_ =
       (local_60->super_AlexNode<int,_int>).duplication_factor_;
  (local_b8->super_AlexNode<int,_int>).level_ = (local_60->super_AlexNode<int,_int>).level_;
  (local_c0->super_AlexNode<int,_int>).level_ = (local_60->super_AlexNode<int,_int>).level_;
  link_data_nodes(in_RDI,local_60,local_b8,local_c0);
  local_c8 = local_60;
  std::vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>::push_back
            ((vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_> *)
             CONCAT44(in_stack_fffffffffffffad4,uVar8),
             (value_type *)CONCAT44(in_stack_fffffffffffffacc,uVar7));
  (in_RDI->stats_).num_data_nodes = (in_RDI->stats_).num_data_nodes + -1;
  if ((local_29 & 1) != 0) {
    poVar2 = std::operator<<((ostream *)&std::cout,"[Splitting upwards data node] level ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,(local_60->super_AlexNode<int,_int>).level_)
    ;
    poVar2 = std::operator<<(poVar2,", node addr: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_60);
    poVar2 = std::operator<<(poVar2,", node repeats in parent: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_64);
    poVar2 = std::operator<<(poVar2,", node indexes in parent: [");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_68);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_74);
    poVar2 = std::operator<<(poVar2,")");
    poVar2 = std::operator<<(poVar2,", left leaf indexes: [0, ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_94);
    poVar2 = std::operator<<(poVar2,")");
    poVar2 = std::operator<<(poVar2,", right leaf indexes: [");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_94);
    poVar2 = std::operator<<(poVar2,", ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_60->data_capacity_);
    poVar2 = std::operator<<(poVar2,")");
    poVar2 = std::operator<<(poVar2,", new nodes addr: ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_b8);
    poVar2 = std::operator<<(poVar2,",");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_c0);
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  dVar10 = LinearModel<int>::predict_double(&(local_58->super_AlexNode<int,_int>).model_,local_c);
  if (local_70 <= dVar10) {
    local_d0 = local_c0;
  }
  else {
    local_d0 = local_b8;
  }
  local_d8 = local_b8;
  local_e0 = local_c0;
  sVar3 = std::
          vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
          ::size(local_18);
  local_e4 = (int)sVar3;
  do {
    local_e4 = local_e4 + -1;
    pvVar4 = std::
             vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
             ::operator[](local_18,(long)local_e4);
    iVar11 = (int)((ulong)in_stack_fffffffffffffb18 >> 0x20);
    if ((pvVar4->node->super_AlexNode<int,_int>).level_ <= local_10) {
      local_1d8 = std::
                  vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                  ::operator[](local_18,(long)local_e4);
      local_1e0 = local_1d8->node;
      if ((local_1e0->super_AlexNode<int,_int>).level_ == local_10) {
        iVar12 = local_e4;
        sVar3 = std::
                vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
                ::size(local_18);
        if (iVar12 == (int)sVar3 + -1) {
          *local_28 = (long)local_1e0;
        }
        local_1e4 = local_1d8->bucketID;
        local_1e8 = 1 << ((local_d8->super_AlexNode<int,_int>).duplication_factor_ & 0x1f);
        if ((local_29 & 1) != 0) {
          poVar2 = std::operator<<((ostream *)&std::cout,"[Splitting upwards top node] level ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_10);
          poVar2 = std::operator<<(poVar2,", node addr: ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1e0);
          poVar2 = std::operator<<(poVar2,", node children: ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_1e0->num_children_);
          in_stack_fffffffffffffb20 =
               (AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *)
               std::operator<<(poVar2,", child index: ");
          poVar2 = (ostream *)
                   std::ostream::operator<<((ostream *)in_stack_fffffffffffffb20,local_1e4);
          in_stack_fffffffffffffb10 =
               (Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
               std::operator<<(poVar2,", child repeats in node: ");
          iVar11 = (int)((ulong)poVar2 >> 0x20);
          in_stack_fffffffffffffb08 =
               (AlexNode<int,_int> *)
               std::ostream::operator<<((ostream *)in_stack_fffffffffffffb10,local_1e8);
          poVar2 = std::operator<<((ostream *)in_stack_fffffffffffffb08,", node repeats in parent: "
                                  );
          poVar2 = (ostream *)
                   std::ostream::operator<<
                             (poVar2,1 << ((local_1e0->super_AlexNode<int,_int>).duplication_factor_
                                          & 0x1f));
          std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        }
        if (local_1e8 == 1) {
          (in_RDI->stats_).num_model_node_expansions =
               (in_RDI->stats_).num_model_node_expansions + 1;
          (in_RDI->stats_).num_model_node_expansion_pointers =
               (in_RDI->stats_).num_model_node_expansion_pointers + (long)local_1e0->num_children_;
          AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>::expand
                    (in_stack_fffffffffffffb20,iVar11);
          local_1e4 = local_1e4 << 1;
          local_1e8 = local_1e8 << 1;
        }
        else {
          (local_d8->super_AlexNode<int,_int>).duplication_factor_ =
               (local_d8->super_AlexNode<int,_int>).duplication_factor_ + 0xff;
          (local_e0->super_AlexNode<int,_int>).duplication_factor_ =
               (local_e0->super_AlexNode<int,_int>).duplication_factor_ + 0xff;
        }
        local_1ec = local_1e4 - local_1e4 % local_1e8;
        local_1f0 = local_1ec + local_1e8 / 2;
        local_1f4 = local_1ec + local_1e8;
        for (local_1f8 = local_1ec; local_1fc = local_1f0, local_1f8 < local_1f0;
            local_1f8 = local_1f8 + 1) {
          local_1e0->children_[local_1f8] = &local_d8->super_AlexNode<int,_int>;
        }
        for (; local_1fc < local_1f4; local_1fc = local_1fc + 1) {
          local_1e0->children_[local_1fc] = &local_e0->super_AlexNode<int,_int>;
        }
        local_208 = local_48;
        local_210._M_current =
             (AlexNode<int,_int> **)
             std::vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>::
             begin((vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                    *)CONCAT44(in_stack_fffffffffffffacc,uVar7));
        std::vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>::end
                  ((vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>
                    *)CONCAT44(in_stack_fffffffffffffacc,uVar7));
        while (bVar1 = __gnu_cxx::operator!=
                                 ((__normal_iterator<alex::AlexNode<int,_int>_**,_std::vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffad4,uVar8),
                                  (__normal_iterator<alex::AlexNode<int,_int>_**,_std::vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
                                   *)CONCAT44(in_stack_fffffffffffffacc,uVar7)), pdVar5 = local_d0,
              bVar1) {
          __gnu_cxx::
          __normal_iterator<alex::AlexNode<int,_int>_**,_std::vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
          ::operator*(&local_210);
          delete_node(in_stack_fffffffffffffb10,in_stack_fffffffffffffb08);
          __gnu_cxx::
          __normal_iterator<alex::AlexNode<int,_int>_**,_std::vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>_>
          ::operator++(&local_210);
        }
        std::vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>::
        ~vector((vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_> *)
                in_stack_fffffffffffffae0);
        return pdVar5;
      }
      __assert_fail("top_node->level_ == stop_propagation_level",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/examples/../core/alex.h"
                    ,0x846,
                    "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                   );
    }
    local_f0 = std::
               vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
               ::operator[](local_18,(long)local_e4);
    local_f8 = local_f0->node;
    (in_RDI->stats_).num_model_node_splits = (in_RDI->stats_).num_model_node_splits + 1;
    (in_RDI->stats_).num_model_node_split_pointers =
         (long)local_f8->num_children_ + (in_RDI->stats_).num_model_node_split_pointers;
    local_f9 = local_f0->bucketID < local_f8->num_children_ / 2;
    local_108 = (data_node_type *)0x0;
    local_110 = (data_node_type *)0x0;
    local_111 = 0;
    local_112 = 0;
    local_120 = *local_f8->children_;
    local_128 = local_f8->children_[local_f8->num_children_ / 2];
    if (((bool)local_f9) &&
       (1 << (local_128->duplication_factor_ & 0x1f) == local_f8->num_children_ / 2)) {
      local_112 = 1;
      model_node_allocator
                ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
                 CONCAT44(in_stack_fffffffffffffacc,uVar7));
      pdVar5 = (data_node_type *)
               __gnu_cxx::
               new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>
               ::allocate((new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>
                           *)in_stack_fffffffffffffae0,
                          CONCAT26(in_stack_fffffffffffffade,
                                   CONCAT24(in_stack_fffffffffffffadc,uVar9)),
                          (void *)CONCAT44(in_stack_fffffffffffffad4,uVar8));
      AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>::AlexModelNode
                ((AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *)
                 in_stack_fffffffffffffae0,in_stack_fffffffffffffade,
                 (allocator<std::pair<int,_int>_> *)CONCAT44(in_stack_fffffffffffffad4,uVar8));
      local_108 = pdVar5;
      std::allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>::
      ~allocator((allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_> *
                 )0x11741b);
    }
    else if (((bool)local_f9) ||
            (1 << (local_120->duplication_factor_ & 0x1f) != local_f8->num_children_ / 2)) {
      model_node_allocator
                ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
                 CONCAT44(in_stack_fffffffffffffacc,uVar7));
      pdVar5 = (data_node_type *)
               __gnu_cxx::
               new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>
               ::allocate((new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>
                           *)in_stack_fffffffffffffae0,
                          CONCAT26(in_stack_fffffffffffffade,
                                   CONCAT24(in_stack_fffffffffffffadc,uVar9)),
                          (void *)CONCAT44(in_stack_fffffffffffffad4,uVar8));
      AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>::AlexModelNode
                ((AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *)
                 in_stack_fffffffffffffae0,in_stack_fffffffffffffade,
                 (allocator<std::pair<int,_int>_> *)CONCAT44(in_stack_fffffffffffffad4,uVar8));
      local_108 = pdVar5;
      std::allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>::
      ~allocator((allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_> *
                 )0x1175cd);
      model_node_allocator
                ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
                 CONCAT44(in_stack_fffffffffffffacc,uVar7));
      pdVar5 = (data_node_type *)
               __gnu_cxx::
               new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>
               ::allocate((new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>
                           *)in_stack_fffffffffffffae0,
                          CONCAT26(in_stack_fffffffffffffade,
                                   CONCAT24(in_stack_fffffffffffffadc,uVar9)),
                          (void *)CONCAT44(in_stack_fffffffffffffad4,uVar8));
      AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>::AlexModelNode
                ((AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *)
                 in_stack_fffffffffffffae0,in_stack_fffffffffffffade,
                 (allocator<std::pair<int,_int>_> *)CONCAT44(in_stack_fffffffffffffad4,uVar8));
      local_110 = pdVar5;
      std::allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>::
      ~allocator((allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_> *
                 )0x117651);
    }
    else {
      local_111 = 1;
      model_node_allocator
                ((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *)
                 CONCAT44(in_stack_fffffffffffffacc,uVar7));
      pdVar5 = (data_node_type *)
               __gnu_cxx::
               new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>
               ::allocate((new_allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>
                           *)in_stack_fffffffffffffae0,
                          CONCAT26(in_stack_fffffffffffffade,
                                   CONCAT24(in_stack_fffffffffffffadc,uVar9)),
                          (void *)CONCAT44(in_stack_fffffffffffffad4,uVar8));
      AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>::AlexModelNode
                ((AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_> *)
                 in_stack_fffffffffffffae0,in_stack_fffffffffffffade,
                 (allocator<std::pair<int,_int>_> *)CONCAT44(in_stack_fffffffffffffad4,uVar8));
      local_110 = pdVar5;
      std::allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_>::
      ~allocator((allocator<alex::AlexModelNode<int,_int,_std::allocator<std::pair<int,_int>_>_>_> *
                 )0x11751e);
    }
    iVar11 = local_e4;
    local_138 = (data_node_type *)0x0;
    local_140 = (data_node_type *)0x0;
    if ((local_f9 & 1) == 0) {
      if (local_110 == (data_node_type *)0x0) {
        __assert_fail("right_split != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/examples/../core/alex.h"
                      ,0x7ed,
                      "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                     );
      }
      sVar3 = std::
              vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
              ::size(local_18);
      if (iVar11 == (int)sVar3 + -1) {
        *local_28 = (long)local_110;
      }
      if ((local_111 & 1) == 0) {
        *(int *)&local_108->allocator_ = local_f8->num_children_ / 2;
        pointer_allocator((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                           *)CONCAT44(in_stack_fffffffffffffacc,uVar7));
        psVar6 = (self_type *)
                 __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                           ((new_allocator<alex::AlexNode<int,_int>_*> *)in_stack_fffffffffffffae0,
                            CONCAT26(in_stack_fffffffffffffade,
                                     CONCAT24(in_stack_fffffffffffffadc,uVar9)),
                            (void *)CONCAT44(in_stack_fffffffffffffad4,uVar8));
        local_108->next_leaf_ = psVar6;
        std::allocator<alex::AlexNode<int,_int>_*>::~allocator
                  ((allocator<alex::AlexNode<int,_int>_*> *)0x117de9);
        (local_108->super_AlexNode<int,_int>).model_.a_ =
             (local_f8->super_AlexNode<int,_int>).model_.a_;
        (local_108->super_AlexNode<int,_int>).model_.b_ =
             (local_f8->super_AlexNode<int,_int>).model_.b_;
        local_188 = 0;
        for (local_18c = 0; local_18c < local_f8->num_children_ / 2; local_18c = local_18c + 1) {
          (&(local_108->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[local_188] =
               (_func_int **)local_f8->children_[local_18c];
          local_188 = local_188 + 1;
        }
        local_138 = local_108;
      }
      else {
        local_138 = (data_node_type *)*local_f8->children_;
        (local_138->super_AlexNode<int,_int>).level_ = (local_f8->super_AlexNode<int,_int>).level_;
      }
      *(int *)&local_110->allocator_ = local_f8->num_children_;
      pointer_allocator((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                         *)CONCAT44(in_stack_fffffffffffffacc,uVar7));
      psVar6 = (self_type *)
               __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                         ((new_allocator<alex::AlexNode<int,_int>_*> *)in_stack_fffffffffffffae0,
                          CONCAT26(in_stack_fffffffffffffade,
                                   CONCAT24(in_stack_fffffffffffffadc,uVar9)),
                          (void *)CONCAT44(in_stack_fffffffffffffad4,uVar8));
      local_110->next_leaf_ = psVar6;
      std::allocator<alex::AlexNode<int,_int>_*>::~allocator
                ((allocator<alex::AlexNode<int,_int>_*> *)0x117f69);
      (local_110->super_AlexNode<int,_int>).model_.a_ =
           (local_f8->super_AlexNode<int,_int>).model_.a_ * 2.0;
      (local_110->super_AlexNode<int,_int>).model_.b_ =
           ((local_f8->super_AlexNode<int,_int>).model_.b_ - (double)(local_f8->num_children_ / 2))
           * 2.0;
      for (local_194 = local_f8->num_children_ / 2; local_194 < local_f8->num_children_;
          local_194 = local_1a4 + local_194) {
        local_1a0 = local_f8->children_[local_194];
        local_1a4 = 1 << (local_1a0->duplication_factor_ & 0x1f);
        local_1a8 = local_194 - local_f8->num_children_ / 2;
        for (local_1ac = local_1a8 * 2;
            SBORROW4(local_1ac,(local_1a8 + local_1a4) * 2) !=
            local_1ac + (local_1a8 + local_1a4) * -2 < 0; local_1ac = local_1ac + 1) {
          (&(local_110->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[local_1ac] =
               (_func_int **)local_1a0;
        }
        local_1a0->duplication_factor_ = local_1a0->duplication_factor_ + '\x01';
      }
      if (local_194 != local_f8->num_children_) {
        __assert_fail("cur == cur_node->num_children_",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/examples/../core/alex.h"
                      ,0x816,
                      "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                     );
      }
      local_1b0 = (local_f0->bucketID - local_f8->num_children_ / 2) * 2;
      local_1b4 = 1 << ((local_d8->super_AlexNode<int,_int>).duplication_factor_ + 1 & 0x1f);
      local_1b8 = local_1b0 - local_1b0 % local_1b4;
      local_1bc = local_1b8 + local_1b4 / 2;
      local_1c0 = local_1b8 + local_1b4;
      for (local_1c4 = local_1b8; local_1c8 = local_1bc, local_1c4 < local_1bc;
          local_1c4 = local_1c4 + 1) {
        (&(local_110->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[local_1c4] =
             (_func_int **)local_d8;
      }
      for (; local_1c8 < local_1c0; local_1c8 = local_1c8 + 1) {
        (&(local_110->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[local_1c8] =
             (_func_int **)local_e0;
      }
      local_140 = local_110;
    }
    else {
      if (local_108 == (data_node_type *)0x0) {
        __assert_fail("left_split != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/examples/../core/alex.h"
                      ,0x7b2,
                      "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                     );
      }
      sVar3 = std::
              vector<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode,_std::allocator<alex::Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::TraversalNode>_>
              ::size(local_18);
      if (iVar11 == (int)sVar3 + -1) {
        *local_28 = (long)local_108;
      }
      *(int *)&local_108->allocator_ = local_f8->num_children_;
      pointer_allocator((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                         *)CONCAT44(in_stack_fffffffffffffacc,uVar7));
      psVar6 = (self_type *)
               __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                         ((new_allocator<alex::AlexNode<int,_int>_*> *)in_stack_fffffffffffffae0,
                          CONCAT26(in_stack_fffffffffffffade,
                                   CONCAT24(in_stack_fffffffffffffadc,uVar9)),
                          (void *)CONCAT44(in_stack_fffffffffffffad4,uVar8));
      local_108->next_leaf_ = psVar6;
      std::allocator<alex::AlexNode<int,_int>_*>::~allocator
                ((allocator<alex::AlexNode<int,_int>_*> *)0x1177ad);
      (local_108->super_AlexNode<int,_int>).model_.a_ =
           (local_f8->super_AlexNode<int,_int>).model_.a_ * 2.0;
      (local_108->super_AlexNode<int,_int>).model_.b_ =
           (local_f8->super_AlexNode<int,_int>).model_.b_ * 2.0;
      for (local_148 = 0; local_148 < local_f8->num_children_ / 2; local_148 = local_154 + local_148
          ) {
        local_150 = local_f8->children_[local_148];
        local_154 = 1 << (local_150->duplication_factor_ & 0x1f);
        for (local_158 = local_148 << 1;
            SBORROW4(local_158,(local_148 + local_154) * 2) !=
            local_158 + (local_148 + local_154) * -2 < 0; local_158 = local_158 + 1) {
          (&(local_108->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[local_158] =
               (_func_int **)local_150;
        }
        local_150->duplication_factor_ = local_150->duplication_factor_ + '\x01';
      }
      if (local_148 != local_f8->num_children_ / 2) {
        __assert_fail("cur == cur_node->num_children_ / 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/examples/../core/alex.h"
                      ,0x7c6,
                      "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                     );
      }
      if ((local_112 & 1) == 0) {
        *(int *)&local_110->allocator_ = local_f8->num_children_ / 2;
        pointer_allocator((Alex<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                           *)CONCAT44(in_stack_fffffffffffffacc,uVar7));
        psVar6 = (self_type *)
                 __gnu_cxx::new_allocator<alex::AlexNode<int,_int>_*>::allocate
                           ((new_allocator<alex::AlexNode<int,_int>_*> *)in_stack_fffffffffffffae0,
                            CONCAT26(in_stack_fffffffffffffade,
                                     CONCAT24(in_stack_fffffffffffffadc,uVar9)),
                            (void *)CONCAT44(in_stack_fffffffffffffad4,uVar8));
        local_110->next_leaf_ = psVar6;
        std::allocator<alex::AlexNode<int,_int>_*>::~allocator
                  ((allocator<alex::AlexNode<int,_int>_*> *)0x117a51);
        (local_110->super_AlexNode<int,_int>).model_.a_ =
             (local_f8->super_AlexNode<int,_int>).model_.a_;
        (local_110->super_AlexNode<int,_int>).model_.b_ =
             (local_f8->super_AlexNode<int,_int>).model_.b_ - (double)(local_f8->num_children_ / 2);
        local_160 = 0;
        for (local_164 = local_f8->num_children_ / 2; local_164 < local_f8->num_children_;
            local_164 = local_164 + 1) {
          (&(local_110->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[local_160] =
               (_func_int **)local_f8->children_[local_164];
          local_160 = local_160 + 1;
        }
        local_140 = local_110;
      }
      else {
        local_140 = (data_node_type *)local_f8->children_[local_f8->num_children_ / 2];
        (local_140->super_AlexNode<int,_int>).level_ = (local_f8->super_AlexNode<int,_int>).level_;
      }
      local_168 = local_f0->bucketID * 2;
      local_16c = 1 << ((local_d8->super_AlexNode<int,_int>).duplication_factor_ + 1 & 0x1f);
      local_170 = local_168 - local_168 % local_16c;
      local_174 = local_170 + local_16c / 2;
      local_178 = local_170 + local_16c;
      for (local_17c = local_170; local_180 = local_174, local_17c < local_174;
          local_17c = local_17c + 1) {
        (&(local_108->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[local_17c] =
             (_func_int **)local_d8;
      }
      for (; local_180 < local_178; local_180 = local_180 + 1) {
        (&(local_108->next_leaf_->super_AlexNode<int,_int>)._vptr_AlexNode)[local_180] =
             (_func_int **)local_e0;
      }
      local_138 = local_108;
    }
    if (local_138 == (data_node_type *)0x0 || local_140 == (data_node_type *)0x0) {
      __assert_fail("next_left_split != nullptr && next_right_split != nullptr",
                    "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]ALEX/src/examples/../core/alex.h"
                    ,0x829,
                    "data_node_type *alex::Alex<int, int>::split_upwards(T, int, const std::vector<TraversalNode> &, bool, model_node_type **, bool) [T = int, P = int, Compare = alex::AlexCompare, Alloc = std::allocator<std::pair<int, int>>, allow_duplicates = true]"
                   );
    }
    if ((local_29 & 1) != 0) {
      poVar2 = std::operator<<((ostream *)&std::cout,"[Splitting upwards through-node] level ");
      poVar2 = (ostream *)
               std::ostream::operator<<(poVar2,(local_f8->super_AlexNode<int,_int>).level_);
      poVar2 = std::operator<<(poVar2,", node addr: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_f0->node);
      poVar2 = std::operator<<(poVar2,", node children: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_f0->node->num_children_);
      poVar2 = std::operator<<(poVar2,", child index: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_f0->bucketID);
      poVar2 = std::operator<<(poVar2,", child repeats in node: ");
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,1 << ((local_d8->super_AlexNode<int,_int>).duplication_factor_ &
                                      0x1f));
      poVar2 = std::operator<<(poVar2,", node repeats in parent: ");
      poVar2 = (ostream *)
               std::ostream::operator<<
                         (poVar2,1 << ((local_f0->node->super_AlexNode<int,_int>).
                                       duplication_factor_ & 0x1f));
      poVar2 = std::operator<<(poVar2,", new nodes addr: ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_108);
      poVar2 = std::operator<<(poVar2,",");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_110);
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    }
    local_1d0 = local_f8;
    std::vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_>::push_back
              ((vector<alex::AlexNode<int,_int>_*,_std::allocator<alex::AlexNode<int,_int>_*>_> *)
               CONCAT44(in_stack_fffffffffffffad4,uVar8),
               (value_type *)CONCAT44(in_stack_fffffffffffffacc,uVar7));
    if (((local_111 & 1) == 0) && ((local_112 & 1) == 0)) {
      (in_RDI->stats_).num_model_nodes = (in_RDI->stats_).num_model_nodes + 1;
    }
    (local_138->super_AlexNode<int,_int>).duplication_factor_ =
         (local_f8->super_AlexNode<int,_int>).duplication_factor_;
    (local_140->super_AlexNode<int,_int>).duplication_factor_ =
         (local_f8->super_AlexNode<int,_int>).duplication_factor_;
    local_d8 = local_138;
    local_e0 = local_140;
  } while( true );
}

Assistant:

data_node_type* split_upwards(
      T key, int stop_propagation_level,
      const std::vector<TraversalNode>& traversal_path, bool reuse_model,
      model_node_type** new_parent, bool verbose = false) {
    assert(stop_propagation_level >= root_node_->level_);
    std::vector<AlexNode<T, P>*> to_delete;  // nodes that need to be deleted

    // Split the data node into two new data nodes
    const TraversalNode& parent_path_node = traversal_path.back();
    model_node_type* parent = parent_path_node.node;
    auto leaf = static_cast<data_node_type*>(
        parent->children_[parent_path_node.bucketID]);
    int leaf_repeats = 1 << (leaf->duplication_factor_);
    int leaf_start_bucketID =
        parent_path_node.bucketID - (parent_path_node.bucketID % leaf_repeats);
    double leaf_mid_bucketID = leaf_start_bucketID + leaf_repeats / 2.0;
    int leaf_end_bucketID =
        leaf_start_bucketID + leaf_repeats;  // first bucket with next child
    stats_.num_sideways_splits++;
    stats_.num_sideways_split_keys += leaf->num_keys_;

    // Determine if either of the two new data nodes will need to adapt to
    // append-mostly behavior
    bool append_mostly_right = leaf->is_append_mostly_right();
    bool left_half_appending_right = false, right_half_appending_right = false;
    if (append_mostly_right) {
      double appending_right_bucketID =
          parent->model_.predict_double(leaf->max_key_);
      if (appending_right_bucketID >= leaf_start_bucketID &&
          appending_right_bucketID < leaf_mid_bucketID) {
        left_half_appending_right = true;
      } else if (appending_right_bucketID >= leaf_mid_bucketID &&
                 appending_right_bucketID < leaf_end_bucketID) {
        right_half_appending_right = true;
      }
    }
    bool append_mostly_left = leaf->is_append_mostly_left();
    bool left_half_appending_left = false, right_half_appending_left = false;
    if (append_mostly_left) {
      double appending_left_bucketID =
          parent->model_.predict_double(leaf->min_key_);
      if (appending_left_bucketID >= leaf_start_bucketID &&
          appending_left_bucketID < leaf_mid_bucketID) {
        left_half_appending_left = true;
      } else if (appending_left_bucketID >= leaf_mid_bucketID &&
                 appending_left_bucketID < leaf_end_bucketID) {
        right_half_appending_left = true;
      }
    }

    int mid_boundary = leaf->lower_bound(
        (leaf_mid_bucketID - parent->model_.b_) / parent->model_.a_);
    data_node_type* left_leaf = bulk_load_leaf_node_from_existing(
        leaf, 0, mid_boundary, true, nullptr, reuse_model,
        append_mostly_right && left_half_appending_right,
        append_mostly_left && left_half_appending_left);
    data_node_type* right_leaf = bulk_load_leaf_node_from_existing(
        leaf, mid_boundary, leaf->data_capacity_, true, nullptr, reuse_model,
        append_mostly_right && right_half_appending_right,
        append_mostly_left && right_half_appending_left);
    // This is the expected duplication factor; it will be correct once we
    // split/expand the parent
    left_leaf->duplication_factor_ = leaf->duplication_factor_;
    right_leaf->duplication_factor_ = leaf->duplication_factor_;
    left_leaf->level_ = leaf->level_;
    right_leaf->level_ = leaf->level_;
    link_data_nodes(leaf, left_leaf, right_leaf);
    to_delete.push_back(leaf);
    stats_.num_data_nodes--;

    if (verbose) {
      std::cout << "[Splitting upwards data node] level " << leaf->level_
                << ", node addr: " << leaf
                << ", node repeats in parent: " << leaf_repeats
                << ", node indexes in parent: [" << leaf_start_bucketID << ", "
                << leaf_end_bucketID << ")"
                << ", left leaf indexes: [0, " << mid_boundary << ")"
                << ", right leaf indexes: [" << mid_boundary << ", "
                << leaf->data_capacity_ << ")"
                << ", new nodes addr: " << left_leaf << "," << right_leaf
                << std::endl;
    }

    // The new data node that the key falls into is the one we return
    data_node_type* new_data_node;
    if (parent->model_.predict_double(key) < leaf_mid_bucketID) {
      new_data_node = left_leaf;
    } else {
      new_data_node = right_leaf;
    }

    // Split all internal nodes from the parent up to the highest node along the
    // traversal path.
    // As this happens, the entries of the traversal path will go stale, which
    // is fine because we no longer use them.
    // Splitting an internal node involves dividing the child pointers into two
    // halves, and doubling the relevant half.
    AlexNode<T, P>* prev_left_split = left_leaf;
    AlexNode<T, P>* prev_right_split = right_leaf;
    int path_idx = static_cast<int>(traversal_path.size()) - 1;
    while (traversal_path[path_idx].node->level_ > stop_propagation_level) {
      // Decide which half to double
      const TraversalNode& path_node = traversal_path[path_idx];
      model_node_type* cur_node = path_node.node;
      stats_.num_model_node_splits++;
      stats_.num_model_node_split_pointers += cur_node->num_children_;
      bool double_left_half = path_node.bucketID < cur_node->num_children_ / 2;
      model_node_type* left_split = nullptr;
      model_node_type* right_split = nullptr;

      // If one of the resulting halves will only have one child pointer, we
      // should "pull up" that child
      bool pull_up_left_child = false, pull_up_right_child = false;
      AlexNode<T, P>* left_half_first_child = cur_node->children_[0];
      AlexNode<T, P>* right_half_first_child =
          cur_node->children_[cur_node->num_children_ / 2];
      if (double_left_half &&
          (1 << right_half_first_child->duplication_factor_) ==
              cur_node->num_children_ / 2) {
        // pull up right child if all children in the right half are the same
        pull_up_right_child = true;
        left_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      } else if (!double_left_half &&
                 (1 << left_half_first_child->duplication_factor_) ==
                     cur_node->num_children_ / 2) {
        // pull up left child if all children in the left half are the same
        pull_up_left_child = true;
        right_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      } else {
        left_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
        right_split = new (model_node_allocator().allocate(1))
            model_node_type(cur_node->level_, allocator_);
      }

      // Do the split
      AlexNode<T, P>* next_left_split = nullptr;
      AlexNode<T, P>* next_right_split = nullptr;
      if (double_left_half) {
        // double left half
        assert(left_split != nullptr);
        if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
          *new_parent = left_split;
        }
        left_split->num_children_ = cur_node->num_children_;
        left_split->children_ =
            new (pointer_allocator().allocate(left_split->num_children_))
                AlexNode<T, P>*[left_split->num_children_];
        left_split->model_.a_ = cur_node->model_.a_ * 2;
        left_split->model_.b_ = cur_node->model_.b_ * 2;
        int cur = 0;
        while (cur < cur_node->num_children_ / 2) {
          AlexNode<T, P>* cur_child = cur_node->children_[cur];
          int cur_child_repeats = 1 << cur_child->duplication_factor_;
          for (int i = 2 * cur; i < 2 * (cur + cur_child_repeats); i++) {
            left_split->children_[i] = cur_child;
          }
          cur_child->duplication_factor_++;
          cur += cur_child_repeats;
        }
        assert(cur == cur_node->num_children_ / 2);

        if (pull_up_right_child) {
          next_right_split = cur_node->children_[cur_node->num_children_ / 2];
          next_right_split->level_ = cur_node->level_;
        } else {
          right_split->num_children_ = cur_node->num_children_ / 2;
          right_split->children_ =
              new (pointer_allocator().allocate(right_split->num_children_))
                  AlexNode<T, P>*[right_split->num_children_];
          right_split->model_.a_ = cur_node->model_.a_;
          right_split->model_.b_ =
              cur_node->model_.b_ - cur_node->num_children_ / 2;
          int j = 0;
          for (int i = cur_node->num_children_ / 2; i < cur_node->num_children_;
               i++) {
            right_split->children_[j] = cur_node->children_[i];
            j++;
          }
          next_right_split = right_split;
        }

        int new_bucketID = path_node.bucketID * 2;
        int repeats = 1 << (prev_left_split->duplication_factor_ + 1);
        int start_bucketID =
            new_bucketID -
            (new_bucketID % repeats);  // first bucket with same child
        int mid_bucketID = start_bucketID + repeats / 2;
        int end_bucketID =
            start_bucketID + repeats;  // first bucket with next child
        for (int i = start_bucketID; i < mid_bucketID; i++) {
          left_split->children_[i] = prev_left_split;
        }
        for (int i = mid_bucketID; i < end_bucketID; i++) {
          left_split->children_[i] = prev_right_split;
        }
        next_left_split = left_split;
      } else {
        // double right half
        assert(right_split != nullptr);
        if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
          *new_parent = right_split;
        }
        if (pull_up_left_child) {
          next_left_split = cur_node->children_[0];
          next_left_split->level_ = cur_node->level_;
        } else {
          left_split->num_children_ = cur_node->num_children_ / 2;
          left_split->children_ =
              new (pointer_allocator().allocate(left_split->num_children_))
                  AlexNode<T, P>*[left_split->num_children_];
          left_split->model_.a_ = cur_node->model_.a_;
          left_split->model_.b_ = cur_node->model_.b_;
          int j = 0;
          for (int i = 0; i < cur_node->num_children_ / 2; i++) {
            left_split->children_[j] = cur_node->children_[i];
            j++;
          }
          next_left_split = left_split;
        }

        right_split->num_children_ = cur_node->num_children_;
        right_split->children_ =
            new (pointer_allocator().allocate(right_split->num_children_))
                AlexNode<T, P>*[right_split->num_children_];
        right_split->model_.a_ = cur_node->model_.a_ * 2;
        right_split->model_.b_ =
            (cur_node->model_.b_ - cur_node->num_children_ / 2) * 2;
        int cur = cur_node->num_children_ / 2;
        while (cur < cur_node->num_children_) {
          AlexNode<T, P>* cur_child = cur_node->children_[cur];
          int cur_child_repeats = 1 << cur_child->duplication_factor_;
          int right_child_idx = cur - cur_node->num_children_ / 2;
          for (int i = 2 * right_child_idx;
               i < 2 * (right_child_idx + cur_child_repeats); i++) {
            right_split->children_[i] = cur_child;
          }
          cur_child->duplication_factor_++;
          cur += cur_child_repeats;
        }
        assert(cur == cur_node->num_children_);

        int new_bucketID =
            (path_node.bucketID - cur_node->num_children_ / 2) * 2;
        int repeats = 1 << (prev_left_split->duplication_factor_ + 1);
        int start_bucketID =
            new_bucketID -
            (new_bucketID % repeats);  // first bucket with same child
        int mid_bucketID = start_bucketID + repeats / 2;
        int end_bucketID =
            start_bucketID + repeats;  // first bucket with next child
        for (int i = start_bucketID; i < mid_bucketID; i++) {
          right_split->children_[i] = prev_left_split;
        }
        for (int i = mid_bucketID; i < end_bucketID; i++) {
          right_split->children_[i] = prev_right_split;
        }
        next_right_split = right_split;
      }
      assert(next_left_split != nullptr && next_right_split != nullptr);
      if (verbose) {
        std::cout << "[Splitting upwards through-node] level "
                  << cur_node->level_ << ", node addr: " << path_node.node
                  << ", node children: " << path_node.node->num_children_
                  << ", child index: " << path_node.bucketID
                  << ", child repeats in node: "
                  << (1 << prev_left_split->duplication_factor_)
                  << ", node repeats in parent: "
                  << (1 << path_node.node->duplication_factor_)
                  << ", new nodes addr: " << left_split << "," << right_split
                  << std::endl;
      }
      to_delete.push_back(cur_node);
      if (!pull_up_left_child && !pull_up_right_child) {
        stats_.num_model_nodes++;
      }
      // This is the expected duplication factor; it will be correct once we
      // split/expand the parent
      next_left_split->duplication_factor_ = cur_node->duplication_factor_;
      next_right_split->duplication_factor_ = cur_node->duplication_factor_;
      prev_left_split = next_left_split;
      prev_right_split = next_right_split;
      path_idx--;
    }

    // Insert into the top node
    const TraversalNode& top_path_node = traversal_path[path_idx];
    model_node_type* top_node = top_path_node.node;
    assert(top_node->level_ == stop_propagation_level);
    if (path_idx == static_cast<int>(traversal_path.size()) - 1) {
      *new_parent = top_node;
    }
    int top_bucketID = top_path_node.bucketID;
    int repeats =
        1 << prev_left_split->duplication_factor_;  // this was the duplication
                                                    // factor of the child that
                                                    // was deleted
    if (verbose) {
      std::cout << "[Splitting upwards top node] level "
                << stop_propagation_level << ", node addr: " << top_node
                << ", node children: " << top_node->num_children_
                << ", child index: " << top_bucketID
                << ", child repeats in node: " << repeats
                << ", node repeats in parent: "
                << (1 << top_node->duplication_factor_) << std::endl;
    }

    // Expand the top node if necessary
    if (repeats == 1) {
      stats_.num_model_node_expansions++;
      stats_.num_model_node_expansion_pointers += top_node->num_children_;
      top_node->expand(1);  // double size of top node
      top_bucketID *= 2;
      repeats *= 2;
    } else {
      prev_left_split->duplication_factor_--;
      prev_right_split->duplication_factor_--;
    }

    int start_bucketID =
        top_bucketID -
        (top_bucketID % repeats);  // first bucket with same child
    int mid_bucketID = start_bucketID + repeats / 2;
    int end_bucketID =
        start_bucketID + repeats;  // first bucket with next child
    for (int i = start_bucketID; i < mid_bucketID; i++) {
      top_node->children_[i] = prev_left_split;
    }
    for (int i = mid_bucketID; i < end_bucketID; i++) {
      top_node->children_[i] = prev_right_split;
    }

    for (auto node : to_delete) {
      delete_node(node);
    }

    return new_data_node;
  }